

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

int pool_bulk_insert(StringPool *pool,xmlHashTablePtr hash,size_t num)

{
  size_t sVar1;
  int iVar2;
  xmlChar *pxVar3;
  int local_68;
  undefined1 local_61;
  int res;
  xmlChar tmp_key [1];
  size_t k;
  xmlChar *str [3];
  int local_34;
  ulong uStack_30;
  int ret;
  size_t j;
  size_t i;
  size_t num_local;
  xmlHashTablePtr hash_local;
  StringPool *pool_local;
  
  local_34 = 0;
  j = pool->index;
  for (uStack_30 = 0; j < pool->num_strings && uStack_30 < num; uStack_30 = uStack_30 + 1) {
    while( true ) {
      for (_res = 0; _res < pool->num_keys; _res = _res + 1) {
        pxVar3 = gen_random_string(pool->id);
        str[_res - 1] = pxVar3;
      }
      sVar1 = pool->num_keys;
      if (sVar1 == 1) {
        local_68 = xmlHashAddEntry(hash,k,&local_61);
        if ((local_68 == 0) && (iVar2 = xmlHashUpdateEntry(hash,k,k,0), iVar2 != 0)) {
          local_34 = -1;
        }
      }
      else if (sVar1 == 2) {
        local_68 = xmlHashAddEntry2(hash,k,str[0],&local_61);
        if ((local_68 == 0) && (iVar2 = xmlHashUpdateEntry2(hash,k,str[0],k,0), iVar2 != 0)) {
          local_34 = -1;
        }
      }
      else if (((sVar1 == 3) &&
               (local_68 = xmlHashAddEntry3(hash,k,str[0],str[1],&local_61), local_68 == 0)) &&
              (iVar2 = xmlHashUpdateEntry3(hash,k,str[0],str[1],k,0), iVar2 != 0)) {
        local_34 = -1;
      }
      if (local_68 == 0) break;
      for (_res = 0; _res < pool->num_keys; _res = _res + 1) {
        (*_xmlFree)(str[_res - 1]);
      }
    }
    for (_res = 0; _res < pool->num_keys; _res = _res + 1) {
      pool->strings[j] = str[_res - 1];
      j = j + 1;
    }
  }
  pool->index = j;
  return local_34;
}

Assistant:

static int
pool_bulk_insert(StringPool *pool, xmlHashTablePtr hash, size_t num) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar *str[3];
        size_t k;

        while (1) {
            xmlChar tmp_key[1];
            int res;

            for (k = 0; k < pool->num_keys; k++)
                str[k] = gen_random_string(pool->id);

            switch (pool->num_keys) {
                case 1:
                    res = xmlHashAddEntry(hash, str[0], tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry(hash, str[0], str[0], NULL) != 0)
                        ret = -1;
                    break;
                case 2:
                    res = xmlHashAddEntry2(hash, str[0], str[1], tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry2(hash, str[0], str[1], str[0],
                                            NULL) != 0)
                        ret = -1;
                    break;
                case 3:
                    res = xmlHashAddEntry3(hash, str[0], str[1], str[2],
                                           tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry3(hash, str[0], str[1], str[2],
                                            str[0], NULL) != 0)
                        ret = -1;
                    break;
            }

            if (res == 0)
                break;
            for (k = 0; k < pool->num_keys; k++)
                xmlFree(str[k]);
        }

        for (k = 0; k < pool->num_keys; k++)
            pool->strings[i++] = str[k];
    }

    pool->index = i;
    return ret;
}